

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

size_t write_vbyte(FILE *f,uint32_t x)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_type sVar1;
  size_t sVar2;
  FILE *in_RDI;
  uint32_t in_stack_0000001c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000020;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  FILE *local_8;
  
  local_8 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17baec);
  vbyte_encode_u32(in_stack_00000020,in_stack_0000001c);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17bb0b);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
  sVar2 = fwrite(this,1,sVar1,local_8);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
  if ((int)sVar2 != (int)sVar1) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
    quit("writing vbyte to file: %d != %d",sVar2 & 0xffffffff,sVar1 & 0xffffffff);
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return sVar1;
}

Assistant:

size_t write_vbyte(FILE* f, uint32_t x)
{
    std::vector<uint8_t> buf;
    vbyte_encode_u32(buf, x);
    int ret = fwrite(buf.data(), 1, buf.size(), f);
    if (ret != (int)buf.size()) {
        quit("writing vbyte to file: %d != %d", ret, (int)buf.size());
    }
    return buf.size();
}